

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O1

void test_counts(void)

{
  _Bool _Var1;
  bitset_t *bitset;
  bitset_t *bitset_00;
  size_t sVar2;
  ulong uVar3;
  byte bVar4;
  int k;
  ulong uVar5;
  ulong uVar6;
  
  bitset = bitset_create();
  bVar4 = 0;
  bitset_00 = bitset_create();
  uVar6 = 0;
  uVar5 = 0;
  do {
    uVar3 = uVar5 >> 5;
    if (uVar3 < bitset->arraysize) {
LAB_001030e9:
      bitset->array[uVar3] = bitset->array[uVar3] | 1L << (bVar4 & 0x3e);
    }
    else {
      _Var1 = bitset_grow(bitset,uVar3 + 1);
      if (_Var1) goto LAB_001030e9;
    }
    uVar3 = uVar6 >> 6;
    if (uVar3 < bitset_00->arraysize) {
LAB_0010311b:
      bitset_00->array[uVar3] = bitset_00->array[uVar3] | 1L << ((byte)uVar6 & 0x3f);
    }
    else {
      _Var1 = bitset_grow(bitset_00,uVar3 + 1);
      if (_Var1) goto LAB_0010311b;
    }
    uVar5 = uVar5 + 1;
    uVar6 = uVar6 + 3;
    bVar4 = bVar4 + 2;
    if (uVar5 == 1000) {
      sVar2 = bitset_intersection_count(bitset,bitset_00);
      _assert_true((ulong)(sVar2 == 0x14e),"bitset_intersection_count(b1, b2) == 334",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                   ,0xbb);
      sVar2 = bitset_union_count(bitset,bitset_00);
      _assert_true((ulong)(sVar2 == 0x682),"bitset_union_count(b1, b2) == 1666",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                   ,0xbc);
      bitset_free(bitset);
      bitset_free(bitset_00);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(test_counts) {
    bitset_t *b1 = bitset_create();
    bitset_t *b2 = bitset_create();

    for (int k = 0; k < 1000; ++k) {
        bitset_set(b1, 2 * k);
        bitset_set(b2, 3 * k);
    }
    assert_true(bitset_intersection_count(b1, b2) == 334);
    assert_true(bitset_union_count(b1, b2) == 1666);
    bitset_free(b1);
    bitset_free(b2);
}